

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionAddStr.cpp
# Opt level: O0

void __thiscall Hpipe::InstructionAddStr::get_code_repr(InstructionAddStr *this,ostream *os)

{
  ostream *poVar1;
  ulong uVar2;
  ostream *os_local;
  InstructionAddStr *this_local;
  
  poVar1 = std::operator<<(os,"ADD_STR ");
  uVar2 = std::__cxx11::string::size();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->var);
  return;
}

Assistant:

void InstructionAddStr::get_code_repr( std::ostream &os ) {
    os << "ADD_STR " << var.size() << " " << var;
}